

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int mark_frames_on_pto(quicly_conn_t *conn,uint8_t ack_epoch,size_t *bytes_to_mark)

{
  quicly_sent_t *pqVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_iter_t local_48;
  
  iVar2 = quicly_loss_init_sentmap_iter
                    (&(conn->egress).loss,&local_48,(conn->stash).now,
                     (uint)(conn->super).remote.transport_params.max_ack_delay,
                     (uint)(QUICLY_STATE_CONNECTED < (conn->super).state));
  if (iVar2 != 0) {
    return iVar2;
  }
  if ((local_48.p)->acked == quicly_sentmap__type_packet) {
    do {
      pqVar1 = local_48.p;
      if (((local_48.p)->data).packet.packet_number == 0xffffffffffffffff) {
        return 0;
      }
      if ((((local_48.p)->data).packet.ack_epoch == ack_epoch) &&
         ((*(byte *)((long)&(local_48.p)->data + 0x11) & 2) != 0)) {
        uVar4 = (ulong)((local_48.p)->data).packet.cc_bytes_in_flight;
        sVar3 = *bytes_to_mark - uVar4;
        if (*bytes_to_mark < uVar4) {
          sVar3 = 0;
        }
        *bytes_to_mark = sVar3;
        iVar2 = quicly_sentmap_update
                          (&(conn->egress).loss.sentmap,&local_48,QUICLY_SENTMAP_EVENT_PTO);
        if (iVar2 != 0) {
          return iVar2;
        }
        if ((*(byte *)((long)&pqVar1->data + 0x11) & 2) != 0) {
          __assert_fail("!sent->frames_in_flight",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0xe1d,"int mark_frames_on_pto(quicly_conn_t *, uint8_t, size_t *)");
        }
        if (*bytes_to_mark == 0) {
          return 0;
        }
      }
      else {
        quicly_sentmap_skip(&local_48);
      }
    } while ((local_48.p)->acked == quicly_sentmap__type_packet);
  }
  __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
}

Assistant:

static int mark_frames_on_pto(quicly_conn_t *conn, uint8_t ack_epoch, size_t *bytes_to_mark)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    if ((ret = init_acks_iter(conn, &iter)) != 0)
        return ret;

    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        if (sent->ack_epoch == ack_epoch && sent->frames_in_flight) {
            *bytes_to_mark = *bytes_to_mark > sent->cc_bytes_in_flight ? *bytes_to_mark - sent->cc_bytes_in_flight : 0;
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_PTO)) != 0)
                return ret;
            assert(!sent->frames_in_flight);
            if (*bytes_to_mark == 0)
                break;
        } else {
            quicly_sentmap_skip(&iter);
        }
    }

    return 0;
}